

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_optimizer.cpp
# Opt level: O0

unsigned_long _computeIntegerOperation<unsigned_long,unsigned_int>(TokenType type,uint x,uint y)

{
  allocator<char> local_41;
  string local_40;
  uint local_1c;
  uint local_18;
  uint y_local;
  uint x_local;
  TokenType type_local;
  
  switch(type) {
  case TOK_OP_ADD:
    _x_local = (ulong)(x + y);
    break;
  case TOK_OP_SUB:
    _x_local = (ulong)(x - y);
    break;
  case TOK_OP_MOD:
    _x_local = (ulong)x % (ulong)y;
    break;
  case TOK_OP_MUL:
    _x_local = (ulong)(x * y);
    break;
  case TOK_OP_DIV:
    _x_local = (ulong)x / (ulong)y;
    break;
  default:
    local_1c = y;
    local_18 = x;
    y_local._2_2_ = type;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Unknown operation",&local_41);
    pfederc::fatal("/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_syntax/src/syntax_optimizer.cpp"
                   ,0x9e,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    _x_local = 0;
  }
  return _x_local;
}

Assistant:

static R _computeIntegerOperation(TokenType type, T x, T y) noexcept {
	switch (type) {
	case TokenType::TOK_OP_ADD:
		return static_cast<R>(x + y);
  case TokenType::TOK_OP_SUB:
		return static_cast<R>(x - y);
  case TokenType::TOK_OP_MUL:
		return static_cast<R>(x * y);
  case TokenType::TOK_OP_DIV:
		return static_cast<R>(x / y);
  case TokenType::TOK_OP_MOD:
		return static_cast<R>(x % y);
	default:
		fatal(__FILE__, __LINE__, "Unknown operation");
		return 0;
	}
}